

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslellipticcurve.cpp
# Opt level: O2

QDebug operator<<(QDebug debug,QSslEllipticCurve curve)

{
  long lVar1;
  Stream *pSVar2;
  long *plVar3;
  QDebug *pQVar4;
  undefined4 in_register_00000034;
  QDebug *this;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_60;
  QDebugStateSaver saver;
  QSslEllipticCurve curve_local;
  
  this = (QDebug *)CONCAT44(in_register_00000034,curve.id);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  _saver = &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver(&saver,this);
  plVar3 = (long *)QDebug::resetFormat();
  *(undefined1 *)(*plVar3 + 0x30) = 0;
  pQVar4 = QDebug::operator<<(this,"QSslEllipticCurve(");
  QSslEllipticCurve::shortName((QString *)&local_60,&curve_local);
  pQVar4 = QDebug::operator<<(pQVar4,(QString *)&local_60);
  QDebug::operator<<(pQVar4,')');
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
  pSVar2 = this->stream;
  this->stream = (Stream *)0x0;
  *(Stream **)debug.stream = pSVar2;
  QDebugStateSaver::~QDebugStateSaver(&saver);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QDebug)debug.stream;
  }
  __stack_chk_fail();
}

Assistant:

QDebug operator<<(QDebug debug, QSslEllipticCurve curve)
{
    QDebugStateSaver saver(debug);
    debug.resetFormat().nospace();
    debug << "QSslEllipticCurve(" << curve.shortName() << ')';
    return debug;
}